

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O3

void PixarLogCleanup(TIFF *tif)

{
  undefined1 auVar1 [16];
  uint8_t *p;
  undefined1 auVar2 [16];
  
  p = tif->tif_data;
  if (p != (uint8_t *)0x0) {
    TIFFPredictorCleanup(tif);
    auVar1 = *(undefined1 (*) [16])(p + 0x110);
    auVar2._0_8_ = auVar1._8_8_;
    auVar2._8_4_ = auVar1._0_4_;
    auVar2._12_4_ = auVar1._4_4_;
    (tif->tif_tagmethods).vsetfield = (TIFFVSetMethod)auVar2._0_8_;
    (tif->tif_tagmethods).vgetfield = (TIFFVGetMethod)auVar2._8_8_;
    if (*(void **)(p + 0x138) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x138));
    }
    if (*(void **)(p + 0x140) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x140));
    }
    if (*(void **)(p + 0x148) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x148));
    }
    if (*(void **)(p + 0x120) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x120));
    }
    if (*(void **)(p + 0x128) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x128));
    }
    if (*(void **)(p + 0x130) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x130));
    }
    if ((p[0x104] & 1) != 0) {
      if (tif->tif_mode == 0) {
        inflateEnd((z_streamp)(p + 0x80));
      }
      else {
        deflateEnd((z_streamp)(p + 0x80));
      }
    }
    if (*(void **)(p + 0xf8) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0xf8));
    }
    _TIFFfreeExt(tif,p);
    tif->tif_data = (uint8_t *)0x0;
    _TIFFSetDefaultCompressionState(tif);
    return;
  }
  __assert_fail("sp != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_pixarlog.c"
                ,0x5c0,"void PixarLogCleanup(TIFF *)");
}

Assistant:

static void PixarLogCleanup(TIFF *tif)
{
    PixarLogState *sp = (PixarLogState *)tif->tif_data;

    assert(sp != 0);

    (void)TIFFPredictorCleanup(tif);

    tif->tif_tagmethods.vgetfield = sp->vgetparent;
    tif->tif_tagmethods.vsetfield = sp->vsetparent;

    if (sp->FromLT2)
        _TIFFfreeExt(tif, sp->FromLT2);
    if (sp->From14)
        _TIFFfreeExt(tif, sp->From14);
    if (sp->From8)
        _TIFFfreeExt(tif, sp->From8);
    if (sp->ToLinearF)
        _TIFFfreeExt(tif, sp->ToLinearF);
    if (sp->ToLinear16)
        _TIFFfreeExt(tif, sp->ToLinear16);
    if (sp->ToLinear8)
        _TIFFfreeExt(tif, sp->ToLinear8);
    if (sp->state & PLSTATE_INIT)
    {
        if (tif->tif_mode == O_RDONLY)
            inflateEnd(&sp->stream);
        else
            deflateEnd(&sp->stream);
    }
    if (sp->tbuf)
        _TIFFfreeExt(tif, sp->tbuf);
    _TIFFfreeExt(tif, sp);
    tif->tif_data = NULL;

    _TIFFSetDefaultCompressionState(tif);
}